

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrDestroyPassthroughColorLutMETA(XrPassthroughColorLutMETA colorLut)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrPassthroughColorLutMETA_T_*>::getWithInstanceInfo
                    (&g_passthroughcolorlutmeta_info,colorLut);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyPassthroughColorLutMETA)(colorLut);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrPassthroughColorLutMETA_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_passthroughcolorlutmeta_info.
                super_HandleInfoBase<XrPassthroughColorLutMETA_T_*,_GenValidUsageXrHandleInfo>,
               colorLut);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyPassthroughColorLutMETA(
    XrPassthroughColorLutMETA colorLut) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_passthroughcolorlutmeta_info.getWithInstanceInfo(colorLut);
        GenValidUsageXrHandleInfo *gen_passthroughcolorlutmeta_info = info_with_instance.first;
        (void)gen_passthroughcolorlutmeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyPassthroughColorLutMETA(colorLut);
        if (XR_SUCCEEDED(result)) {
            g_passthroughcolorlutmeta_info.erase(colorLut);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}